

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<float,_4> __thiscall
tcu::select<float,4>(tcu *this,float trueVal,float falseVal,Vector<bool,_4> *cond)

{
  bool *pbVar1;
  float *pfVar2;
  ulong extraout_XMM0_Qa;
  ulong uVar3;
  undefined4 in_XMM1_Db;
  undefined8 uVar4;
  Vector<float,_4> VVar5;
  float local_3c;
  int local_24;
  int i;
  Vector<bool,_4> *cond_local;
  float falseVal_local;
  float trueVal_local;
  Vector<float,_4> *res;
  
  uVar4 = CONCAT44(in_XMM1_Db,falseVal);
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar3 = extraout_XMM0_Qa;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    pbVar1 = Vector<bool,_4>::operator[](cond,local_24);
    local_3c = falseVal;
    if ((*pbVar1 & 1U) != 0) {
      local_3c = trueVal;
    }
    pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_24);
    uVar3 = (ulong)(uint)local_3c;
    *pfVar2 = local_3c;
  }
  VVar5.m_data[2] = (float)(int)uVar4;
  VVar5.m_data[3] = (float)(int)((ulong)uVar4 >> 0x20);
  VVar5.m_data[0] = (float)(int)uVar3;
  VVar5.m_data[1] = (float)(int)(uVar3 >> 0x20);
  return (Vector<float,_4>)VVar5.m_data;
}

Assistant:

inline Vector<T, Size> select (T trueVal, T falseVal, const Vector<bool, Size>& cond)
{
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res[i] = cond[i] ? trueVal : falseVal;
	return res;
}